

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service_test.cxx
# Opt level: O2

int asio_service_test::message_meta_random_denial_test(void)

{
  RaftAsioPkg *this;
  long lVar1;
  long lVar2;
  element_type *logs;
  int iVar3;
  int32 iVar4;
  ostream *poVar5;
  int __how;
  int __how_00;
  int __how_01;
  pointer ppRVar6;
  int __how_02;
  string *psVar7;
  unsigned_long __val;
  initializer_list<RaftAsioPkg_*> __l;
  initializer_list<std::shared_ptr<nuraft::buffer>_> __l_00;
  atomic<bool> start_denial;
  allocator_type local_531;
  string msg_str;
  buffer_serializer bs;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  local_4e8;
  ptr<buffer> msg;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> pkgs;
  atomic<unsigned_long> write_resp_cb_count;
  atomic<unsigned_long> write_req_cb_count;
  __shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> local_490;
  undefined1 local_480 [16];
  string s3_addr;
  string s2_addr;
  string s1_addr;
  WRITE_META_FUNC local_410;
  READ_META_FUNC local_3f0;
  WRITE_META_FUNC local_3d0;
  READ_META_FUNC local_3b0;
  RaftAsioPkg s1;
  RaftAsioPkg s3;
  RaftAsioPkg s2;
  
  raft_functional_common::reset_log_files();
  std::__cxx11::string::string((string *)&s1_addr,"127.0.0.1:20010",(allocator *)&s1);
  std::__cxx11::string::string((string *)&s2_addr,"127.0.0.1:20020",(allocator *)&s1);
  std::__cxx11::string::string((string *)&s3_addr,"127.0.0.1:20030",(allocator *)&s1);
  RaftAsioPkg::RaftAsioPkg(&s1,1,&s1_addr);
  RaftAsioPkg::RaftAsioPkg(&s2,2,&s2_addr);
  RaftAsioPkg::RaftAsioPkg(&s3,3,&s3_addr);
  __l._M_len = 3;
  __l._M_array = (iterator)&msg_str;
  msg_str._M_dataplus._M_p = (pointer)&s1;
  msg_str._M_string_length = (size_type)&s2;
  msg_str.field_2._M_allocated_capacity = (size_type)&s3;
  std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::vector
            (&pkgs,__l,(allocator_type *)&bs);
  write_req_cb_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  write_resp_cb_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  start_denial._M_base._M_i = (__atomic_base<bool>)false;
  TestSuite::_msg("launching asio-raft servers with meta callback\n");
  for (ppRVar6 = pkgs.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppRVar6 !=
      pkgs.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppRVar6 = ppRVar6 + 1) {
    this = *ppRVar6;
    msg_str._M_dataplus._M_p = (pointer)test_read_meta_random_denial;
    msg_str._M_string_length = (size_type)&start_denial;
    std::function<bool(nuraft::asio_service_meta_cb_params_const&,std::__cxx11::string_const&)>::
    function<std::_Bind<bool(*(std::atomic<bool>*,std::_Placeholder<1>,std::_Placeholder<2>))(std::atomic<bool>*,nuraft::asio_service_meta_cb_params_const&,std::__cxx11::string_const&)>,void>
              ((function<bool(nuraft::asio_service_meta_cb_params_const&,std::__cxx11::string_const&)>
                *)&local_3b0,
               (_Bind<bool_(*(std::atomic<bool>_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::atomic<bool>_*,_const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&msg_str);
    bs._0_8_ = test_write_req_meta_abi_cxx11_;
    bs.buf_ = (buffer *)&write_req_cb_count;
    std::function<std::__cxx11::string(nuraft::asio_service_meta_cb_params_const&)>::
    function<std::_Bind<std::__cxx11::string(*(std::atomic<unsigned_long>*,std::_Placeholder<1>))(std::atomic<unsigned_long>*,nuraft::asio_service_meta_cb_params_const&)>,void>
              ((function<std::__cxx11::string(nuraft::asio_service_meta_cb_params_const&)> *)
               &local_3d0,
               (_Bind<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*(std::atomic<unsigned_long>_*,_std::_Placeholder<1>))(std::atomic<unsigned_long>_*,_const_nuraft::asio_service_meta_cb_params_&)>
                *)&bs);
    local_4e8.
    super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)test_read_meta_random_denial;
    local_4e8.
    super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)&start_denial;
    std::function<bool(nuraft::asio_service_meta_cb_params_const&,std::__cxx11::string_const&)>::
    function<std::_Bind<bool(*(std::atomic<bool>*,std::_Placeholder<1>,std::_Placeholder<2>))(std::atomic<bool>*,nuraft::asio_service_meta_cb_params_const&,std::__cxx11::string_const&)>,void>
              ((function<bool(nuraft::asio_service_meta_cb_params_const&,std::__cxx11::string_const&)>
                *)&local_3f0,
               (_Bind<bool_(*(std::atomic<bool>_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::atomic<bool>_*,_const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_4e8);
    msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)test_write_resp_meta_abi_cxx11_;
    msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&write_resp_cb_count;
    std::function<std::__cxx11::string(nuraft::asio_service_meta_cb_params_const&)>::
    function<std::_Bind<std::__cxx11::string(*(std::atomic<unsigned_long>*,std::_Placeholder<1>))(std::atomic<unsigned_long>*,nuraft::asio_service_meta_cb_params_const&)>,void>
              ((function<std::__cxx11::string(nuraft::asio_service_meta_cb_params_const&)> *)
               &local_410,
               (_Bind<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*(std::atomic<unsigned_long>_*,_std::_Placeholder<1>))(std::atomic<unsigned_long>_*,_const_nuraft::asio_service_meta_cb_params_&)>
                *)&msg);
    RaftAsioPkg::setMetaCallback(this,&local_3b0,&local_3d0,&local_3f0,&local_410,true);
    std::_Function_base::~_Function_base(&local_410.super__Function_base);
    std::_Function_base::~_Function_base(&local_3f0.super__Function_base);
    std::_Function_base::~_Function_base(&local_3d0.super__Function_base);
    std::_Function_base::~_Function_base(&local_3b0.super__Function_base);
  }
  msg_str._M_dataplus._M_p = msg_str._M_dataplus._M_p & 0xffffffffffffff00;
  msg_str._M_string_length = 0;
  msg_str.field_2._M_allocated_capacity = 0;
  msg_str.field_2._8_8_ = 0;
  iVar3 = launch_servers(&pkgs,false,false,true,(init_options *)&msg_str);
  std::_Function_base::~_Function_base((_Function_base *)&msg_str._M_string_length);
  if (iVar3 == 0) {
    TestSuite::_msg("organizing raft group\n");
    iVar3 = make_group(&pkgs);
    if (iVar3 == 0) {
      std::__cxx11::string::string((string *)&msg_str,"wait for Raft group ready",(allocator *)&bs);
      TestSuite::sleep_sec(1,&msg_str);
      std::__cxx11::string::~string((string *)&msg_str);
      if ((((s1.raftServer.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->leader_).super___atomic_base<int>._M_i ==
           (s1.raftServer.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           )->id_) &&
         (((s1.raftServer.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           )->role_)._M_i == leader)) {
        iVar4 = nuraft::raft_server::get_leader
                          (s1.raftServer.
                           super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
        if (iVar4 == 1) {
          iVar4 = nuraft::raft_server::get_leader
                            (s2.raftServer.
                             super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
          if (iVar4 == 1) {
            iVar4 = nuraft::raft_server::get_leader
                              (s3.raftServer.
                               super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
            if (iVar4 == 1) {
              LOCK();
              start_denial._M_base._M_i = (__atomic_base<bool>)true;
              UNLOCK();
              for (__val = 0; __val != 100; __val = __val + 1) {
                std::__cxx11::to_string(&msg_str,__val);
                nuraft::buffer::alloc
                          ((buffer *)
                           &msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>,
                           msg_str._M_string_length + 4);
                nuraft::buffer_serializer::buffer_serializer
                          (&bs,(ptr<buffer> *)
                               &msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>,
                           LITTLE);
                nuraft::buffer_serializer::put_str(&bs,&msg_str);
                logs = s1.raftServer.
                       super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          (&local_490,
                           &msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>);
                __l_00._M_len = 1;
                __l_00._M_array = (iterator)&local_490;
                std::
                vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                ::vector(&local_4e8,__l_00,&local_531);
                nuraft::raft_server::append_entries
                          ((raft_server *)local_480,
                           (vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                            *)logs);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_480 + 8));
                std::
                vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                ::~vector(&local_4e8);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_490._M_refcount);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&msg.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                std::__cxx11::string::~string((string *)&msg_str);
              }
              std::__cxx11::string::string
                        ((string *)&msg_str,"wait for random denial",(allocator *)&bs);
              psVar7 = &msg_str;
              TestSuite::sleep_sec(5,psVar7);
              iVar3 = (int)psVar7;
              std::__cxx11::string::~string((string *)&msg_str);
              nuraft::raft_server::shutdown
                        (s1.raftServer.
                         super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         iVar3,__how);
              nuraft::raft_server::shutdown
                        (s2.raftServer.
                         super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         iVar3,__how_00);
              nuraft::raft_server::shutdown
                        (s3.raftServer.
                         super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         iVar3,__how_01);
              std::__cxx11::string::string((string *)&msg_str,"shutting down",(allocator *)&bs);
              psVar7 = &msg_str;
              TestSuite::sleep_sec(1,psVar7);
              __how_02 = (int)psVar7;
              psVar7 = &msg_str;
              std::__cxx11::string::~string((string *)psVar7);
              iVar3 = 0;
              SimpleLogger::shutdown((int)psVar7,__how_02);
              goto LAB_001853c0;
            }
            poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            poVar5 = std::operator<<(poVar5,"        time: ");
            poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
            TestSuite::getTimeString_abi_cxx11_();
            poVar5 = std::operator<<(poVar5,(string *)&msg_str);
            poVar5 = std::operator<<(poVar5,"\x1b[0m");
            poVar5 = std::operator<<(poVar5,"\n");
            poVar5 = std::operator<<(poVar5,"      thread: ");
            poVar5 = std::operator<<(poVar5,"\x1b[33m");
            lVar1 = *(long *)poVar5;
            lVar2 = *(long *)(lVar1 + -0x18);
            *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffffb5 | 8;
            *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
            poVar5 = std::operator<<(poVar5,0x30);
            bs._0_8_ = pthread_self();
            std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&local_4e8,(id *)&bs);
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
                 *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
            poVar5 = std::operator<<(poVar5,"\x1b[0m");
            poVar5 = std::operator<<(poVar5,"\n");
            poVar5 = std::operator<<(poVar5,"          in: ");
            poVar5 = std::operator<<(poVar5,"\x1b[36m");
            poVar5 = std::operator<<(poVar5,"message_meta_random_denial_test");
            poVar5 = std::operator<<(poVar5,"()\x1b[0m");
            poVar5 = std::operator<<(poVar5,"\n");
            poVar5 = std::operator<<(poVar5,"          at: ");
            poVar5 = std::operator<<(poVar5,"\x1b[32m");
            poVar5 = std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                    );
            poVar5 = std::operator<<(poVar5,"\x1b[0m:");
            poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1ea);
            poVar5 = std::operator<<(poVar5,"\x1b[0m");
            poVar5 = std::operator<<(poVar5,"\n");
            poVar5 = std::operator<<(poVar5,
                                     "    value of: \x1b[1;34ms3.raftServer->get_leader()\x1b[0m\n")
            ;
            poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,1);
            poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
            poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
            std::operator<<(poVar5,"\x1b[0m\n");
            std::__cxx11::string::~string((string *)&msg_str);
            TestSuite::failHandler();
          }
          else {
            poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            poVar5 = std::operator<<(poVar5,"        time: ");
            poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
            TestSuite::getTimeString_abi_cxx11_();
            poVar5 = std::operator<<(poVar5,(string *)&msg_str);
            poVar5 = std::operator<<(poVar5,"\x1b[0m");
            poVar5 = std::operator<<(poVar5,"\n");
            poVar5 = std::operator<<(poVar5,"      thread: ");
            poVar5 = std::operator<<(poVar5,"\x1b[33m");
            lVar1 = *(long *)poVar5;
            lVar2 = *(long *)(lVar1 + -0x18);
            *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffffb5 | 8;
            *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
            poVar5 = std::operator<<(poVar5,0x30);
            bs._0_8_ = pthread_self();
            std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&local_4e8,(id *)&bs);
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
                 *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
            poVar5 = std::operator<<(poVar5,"\x1b[0m");
            poVar5 = std::operator<<(poVar5,"\n");
            poVar5 = std::operator<<(poVar5,"          in: ");
            poVar5 = std::operator<<(poVar5,"\x1b[36m");
            poVar5 = std::operator<<(poVar5,"message_meta_random_denial_test");
            poVar5 = std::operator<<(poVar5,"()\x1b[0m");
            poVar5 = std::operator<<(poVar5,"\n");
            poVar5 = std::operator<<(poVar5,"          at: ");
            poVar5 = std::operator<<(poVar5,"\x1b[32m");
            poVar5 = std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                    );
            poVar5 = std::operator<<(poVar5,"\x1b[0m:");
            poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1e9);
            poVar5 = std::operator<<(poVar5,"\x1b[0m");
            poVar5 = std::operator<<(poVar5,"\n");
            poVar5 = std::operator<<(poVar5,
                                     "    value of: \x1b[1;34ms2.raftServer->get_leader()\x1b[0m\n")
            ;
            poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,1);
            poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
            poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
            std::operator<<(poVar5,"\x1b[0m\n");
            std::__cxx11::string::~string((string *)&msg_str);
            TestSuite::failHandler();
          }
        }
        else {
          poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          poVar5 = std::operator<<(poVar5,"        time: ");
          poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
          TestSuite::getTimeString_abi_cxx11_();
          poVar5 = std::operator<<(poVar5,(string *)&msg_str);
          poVar5 = std::operator<<(poVar5,"\x1b[0m");
          poVar5 = std::operator<<(poVar5,"\n");
          poVar5 = std::operator<<(poVar5,"      thread: ");
          poVar5 = std::operator<<(poVar5,"\x1b[33m");
          lVar1 = *(long *)poVar5;
          lVar2 = *(long *)(lVar1 + -0x18);
          *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffffb5 | 8;
          *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
          poVar5 = std::operator<<(poVar5,0x30);
          bs._0_8_ = pthread_self();
          std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&local_4e8,(id *)&bs);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
               *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
          poVar5 = std::operator<<(poVar5,"\x1b[0m");
          poVar5 = std::operator<<(poVar5,"\n");
          poVar5 = std::operator<<(poVar5,"          in: ");
          poVar5 = std::operator<<(poVar5,"\x1b[36m");
          poVar5 = std::operator<<(poVar5,"message_meta_random_denial_test");
          poVar5 = std::operator<<(poVar5,"()\x1b[0m");
          poVar5 = std::operator<<(poVar5,"\n");
          poVar5 = std::operator<<(poVar5,"          at: ");
          poVar5 = std::operator<<(poVar5,"\x1b[32m");
          poVar5 = std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                  );
          poVar5 = std::operator<<(poVar5,"\x1b[0m:");
          poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1e8);
          poVar5 = std::operator<<(poVar5,"\x1b[0m");
          poVar5 = std::operator<<(poVar5,"\n");
          poVar5 = std::operator<<(poVar5,
                                   "    value of: \x1b[1;34ms1.raftServer->get_leader()\x1b[0m\n");
          poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,1);
          poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
          poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
          std::operator<<(poVar5,"\x1b[0m\n");
          std::__cxx11::string::~string((string *)&msg_str);
          TestSuite::failHandler();
        }
      }
      else {
        poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        poVar5 = std::operator<<(poVar5,"        time: ");
        poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
        TestSuite::getTimeString_abi_cxx11_();
        poVar5 = std::operator<<(poVar5,(string *)&msg_str);
        poVar5 = std::operator<<(poVar5,"\x1b[0m");
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<(poVar5,"      thread: ");
        poVar5 = std::operator<<(poVar5,"\x1b[33m");
        lVar1 = *(long *)poVar5;
        lVar2 = *(long *)(lVar1 + -0x18);
        *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffffb5 | 8;
        *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
        poVar5 = std::operator<<(poVar5,0x30);
        bs._0_8_ = pthread_self();
        std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&local_4e8,(id *)&bs);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
             *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar5 = std::operator<<(poVar5,"\x1b[0m");
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<(poVar5,"          in: ");
        poVar5 = std::operator<<(poVar5,"\x1b[36m");
        poVar5 = std::operator<<(poVar5,"message_meta_random_denial_test");
        poVar5 = std::operator<<(poVar5,"()\x1b[0m");
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<(poVar5,"          at: ");
        poVar5 = std::operator<<(poVar5,"\x1b[32m");
        poVar5 = std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                                );
        poVar5 = std::operator<<(poVar5,"\x1b[0m:");
        poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1e7);
        poVar5 = std::operator<<(poVar5,"\x1b[0m");
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<(poVar5,
                                 "    value of: \x1b[1;34ms1.raftServer->is_leader()\x1b[0m\n");
        poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
        poVar5 = std::operator<<(poVar5,"true");
        poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
        poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
        poVar5 = std::operator<<(poVar5,"false");
        std::operator<<(poVar5,"\x1b[0m\n");
        std::__cxx11::string::~string((string *)&msg_str);
        TestSuite::failHandler();
      }
      iVar3 = -1;
    }
    else {
      poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar5 = std::operator<<(poVar5,"        time: ");
      poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
      TestSuite::getTimeString_abi_cxx11_();
      poVar5 = std::operator<<(poVar5,(string *)&msg_str);
      poVar5 = std::operator<<(poVar5,"\x1b[0m");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"      thread: ");
      poVar5 = std::operator<<(poVar5,"\x1b[33m");
      lVar1 = *(long *)poVar5;
      lVar2 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffffb5 | 8;
      *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
      poVar5 = std::operator<<(poVar5,0x30);
      bs._0_8_ = pthread_self();
      std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&local_4e8,(id *)&bs);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar5 = std::operator<<(poVar5,"\x1b[0m");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"          in: ");
      poVar5 = std::operator<<(poVar5,"\x1b[36m");
      poVar5 = std::operator<<(poVar5,"message_meta_random_denial_test");
      poVar5 = std::operator<<(poVar5,"()\x1b[0m");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"          at: ");
      poVar5 = std::operator<<(poVar5,"\x1b[32m");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                              );
      poVar5 = std::operator<<(poVar5,"\x1b[0m:");
      poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1e3);
      poVar5 = std::operator<<(poVar5,"\x1b[0m");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"    value of: \x1b[1;34mmake_group(pkgs)\x1b[0m\n");
      poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
      poVar5 = std::operator<<(poVar5,"0");
      poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
      poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
      iVar3 = -1;
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,-1);
      std::operator<<(poVar5,"\x1b[0m\n");
      std::__cxx11::string::~string((string *)&msg_str);
      TestSuite::failHandler();
    }
  }
  else {
    poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar5 = std::operator<<(poVar5,"        time: ");
    poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar5 = std::operator<<(poVar5,(string *)&msg_str);
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"      thread: ");
    poVar5 = std::operator<<(poVar5,"\x1b[33m");
    lVar1 = *(long *)poVar5;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar5 + lVar2 + 0x18) = *(uint *)(poVar5 + lVar2 + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(poVar5 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
    poVar5 = std::operator<<(poVar5,0x30);
    bs._0_8_ = pthread_self();
    std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&local_4e8,(id *)&bs);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"          in: ");
    poVar5 = std::operator<<(poVar5,"\x1b[36m");
    poVar5 = std::operator<<(poVar5,"message_meta_random_denial_test");
    poVar5 = std::operator<<(poVar5,"()\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"          at: ");
    poVar5 = std::operator<<(poVar5,"\x1b[32m");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                            );
    poVar5 = std::operator<<(poVar5,"\x1b[0m:");
    poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1e0);
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"    value of: \x1b[1;34mlaunch_servers(pkgs, false)\x1b[0m\n");
    poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
    poVar5 = std::operator<<(poVar5,"0");
    poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
    poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
    iVar3 = -1;
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,-1);
    std::operator<<(poVar5,"\x1b[0m\n");
    std::__cxx11::string::~string((string *)&msg_str);
    TestSuite::failHandler();
  }
LAB_001853c0:
  std::_Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::~_Vector_base
            (&pkgs.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>);
  RaftAsioPkg::~RaftAsioPkg(&s3);
  RaftAsioPkg::~RaftAsioPkg(&s2);
  RaftAsioPkg::~RaftAsioPkg(&s1);
  std::__cxx11::string::~string((string *)&s3_addr);
  std::__cxx11::string::~string((string *)&s2_addr);
  std::__cxx11::string::~string((string *)&s1_addr);
  return iVar3;
}

Assistant:

int message_meta_random_denial_test() {
    reset_log_files();

    std::string s1_addr = "127.0.0.1:20010";
    std::string s2_addr = "127.0.0.1:20020";
    std::string s3_addr = "127.0.0.1:20030";

    RaftAsioPkg s1(1, s1_addr);
    RaftAsioPkg s2(2, s2_addr);
    RaftAsioPkg s3(3, s3_addr);
    std::vector<RaftAsioPkg*> pkgs = {&s1, &s2, &s3};

    std::atomic<size_t> write_req_cb_count(0);
    std::atomic<size_t> write_resp_cb_count(0);
    std::atomic<bool> start_denial(false);

    _msg("launching asio-raft servers with meta callback\n");
    for (RaftAsioPkg* rr: pkgs) {
        rr->setMetaCallback
            ( std::bind( test_read_meta_random_denial,
                         &start_denial,
                         std::placeholders::_1,
                         std::placeholders::_2 ),
              std::bind( test_write_req_meta,
                         &write_req_cb_count,
                         std::placeholders::_1 ),
              std::bind( test_read_meta_random_denial,
                         &start_denial,
                         std::placeholders::_1,
                         std::placeholders::_2 ),
              std::bind( test_write_resp_meta,
                         &write_resp_cb_count,
                         std::placeholders::_1 ),
              true );
    }
    CHK_Z( launch_servers(pkgs, false) );

    _msg("organizing raft group\n");
    CHK_Z( make_group(pkgs) );

    TestSuite::sleep_sec(1, "wait for Raft group ready");

    CHK_TRUE( s1.raftServer->is_leader() );
    CHK_EQ(1, s1.raftServer->get_leader());
    CHK_EQ(1, s2.raftServer->get_leader());
    CHK_EQ(1, s3.raftServer->get_leader());

    start_denial = true;

    for (size_t ii=0; ii<100; ++ii) {
        std::string msg_str = std::to_string(ii);
        ptr<buffer> msg = buffer::alloc(sizeof(uint32_t) + msg_str.size());
        buffer_serializer bs(msg);
        bs.put_str(msg_str);
        s1.raftServer->append_entries( {msg} );
    }

    TestSuite::sleep_sec(5, "wait for random denial");

    s1.raftServer->shutdown();
    s2.raftServer->shutdown();
    s3.raftServer->shutdown();
    TestSuite::sleep_sec(1, "shutting down");

    SimpleLogger::shutdown();
    return 0;
}